

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_Dxygtdxz(DdManager *dd,int N,DdNode **x,DdNode **y,DdNode **z)

{
  DdNode *g;
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *h;
  DdNode *g_00;
  DdNode *g_01;
  DdNode *h_00;
  int local_84;
  DdNode *pDStack_80;
  int i;
  DdNode *x1;
  DdNode *y2;
  DdNode *y1_;
  DdNode *z4;
  DdNode *z3;
  DdNode *z2;
  DdNode *z1;
  DdNode *zero;
  DdNode *one;
  DdNode **z_local;
  DdNode **y_local;
  DdNode **x_local;
  int N_local;
  DdManager *dd_local;
  
  g = dd->one;
  pDVar1 = Cudd_bddIte(dd,y[N + -1],g,(DdNode *)((ulong)z[N + -1] ^ 1));
  if (pDVar1 == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
    pDVar2 = Cudd_bddIte(dd,y[N + -1],z[N + -1],g);
    if (pDVar2 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar1);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
      pDStack_80 = Cudd_bddIte(dd,x[N + -1],pDVar1,pDVar2);
      if (pDStack_80 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar1);
        Cudd_RecursiveDeref(dd,pDVar2);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref(dd,pDVar1);
        Cudd_RecursiveDeref(dd,pDVar2);
        for (local_84 = N + -2; -1 < local_84; local_84 = local_84 + -1) {
          pDVar1 = Cudd_bddIte(dd,z[local_84],g,(DdNode *)((ulong)pDStack_80 ^ 1));
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDStack_80);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          pDVar2 = Cudd_bddIte(dd,z[local_84],pDStack_80,g);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDStack_80);
            Cudd_RecursiveDeref(dd,pDVar1);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          h = Cudd_bddIte(dd,z[local_84],g,pDStack_80);
          if (h == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDStack_80);
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,pDVar2);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
          g_00 = Cudd_bddIte(dd,z[local_84],pDStack_80,(DdNode *)((ulong)g ^ 1));
          if (g_00 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDStack_80);
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,pDVar2);
            Cudd_RecursiveDeref(dd,h);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,pDStack_80);
          g_01 = Cudd_bddIte(dd,y[local_84],pDVar2,(DdNode *)((ulong)pDVar1 ^ 1));
          if (g_01 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,pDVar2);
            Cudd_RecursiveDeref(dd,h);
            Cudd_RecursiveDeref(dd,g_00);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)g_01 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)g_01 & 0xfffffffffffffffe) + 4) + 1;
          h_00 = Cudd_bddIte(dd,y[local_84],g_00,h);
          if (h_00 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,pDVar2);
            Cudd_RecursiveDeref(dd,h);
            Cudd_RecursiveDeref(dd,g_00);
            Cudd_RecursiveDeref(dd,g_01);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)h_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)h_00 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,pDVar1);
          Cudd_RecursiveDeref(dd,pDVar2);
          Cudd_RecursiveDeref(dd,h);
          Cudd_RecursiveDeref(dd,g_00);
          pDStack_80 = Cudd_bddIte(dd,x[local_84],g_01,h_00);
          if (pDStack_80 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,g_01);
            Cudd_RecursiveDeref(dd,h_00);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,g_01);
          Cudd_RecursiveDeref(dd,h_00);
        }
        *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) + -1;
        dd_local = (DdManager *)((ulong)pDStack_80 ^ 1);
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_Dxygtdxz(
  DdManager * dd /* DD manager */,
  int  N /* number of x, y, and z variables */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */,
  DdNode ** z /* array of z variables */)
{
    DdNode *one, *zero;
    DdNode *z1, *z2, *z3, *z4, *y1_, *y2, *x1;
    int     i;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    /* Build bottom part of BDD outside loop. */
    y1_ = Cudd_bddIte(dd, y[N-1], one, Cudd_Not(z[N-1]));
    if (y1_ == NULL) return(NULL);
    cuddRef(y1_);
    y2 = Cudd_bddIte(dd, y[N-1], z[N-1], one);
    if (y2 == NULL) {
        Cudd_RecursiveDeref(dd, y1_);
        return(NULL);
    }
    cuddRef(y2);
    x1 = Cudd_bddIte(dd, x[N-1], y1_, y2);
    if (x1 == NULL) {
        Cudd_RecursiveDeref(dd, y1_);
        Cudd_RecursiveDeref(dd, y2);
        return(NULL);
    }
    cuddRef(x1);
    Cudd_RecursiveDeref(dd, y1_);
    Cudd_RecursiveDeref(dd, y2);

    /* Loop to build the rest of the BDD. */
    for (i = N-2; i >= 0; i--) {
        z1 = Cudd_bddIte(dd, z[i], one, Cudd_Not(x1));
        if (z1 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            return(NULL);
        }
        cuddRef(z1);
        z2 = Cudd_bddIte(dd, z[i], x1, one);
        if (z2 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            return(NULL);
        }
        cuddRef(z2);
        z3 = Cudd_bddIte(dd, z[i], one, x1);
        if (z3 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            return(NULL);
        }
        cuddRef(z3);
        z4 = Cudd_bddIte(dd, z[i], x1, zero);
        if (z4 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            return(NULL);
        }
        cuddRef(z4);
        Cudd_RecursiveDeref(dd, x1);
        y1_ = Cudd_bddIte(dd, y[i], z2, Cudd_Not(z1));
        if (y1_ == NULL) {
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            Cudd_RecursiveDeref(dd, z4);
            return(NULL);
        }
        cuddRef(y1_);
        y2 = Cudd_bddIte(dd, y[i], z4, z3);
        if (y2 == NULL) {
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            Cudd_RecursiveDeref(dd, z4);
            Cudd_RecursiveDeref(dd, y1_);
            return(NULL);
        }
        cuddRef(y2);
        Cudd_RecursiveDeref(dd, z1);
        Cudd_RecursiveDeref(dd, z2);
        Cudd_RecursiveDeref(dd, z3);
        Cudd_RecursiveDeref(dd, z4);
        x1 = Cudd_bddIte(dd, x[i], y1_, y2);
        if (x1 == NULL) {
            Cudd_RecursiveDeref(dd, y1_);
            Cudd_RecursiveDeref(dd, y2);
            return(NULL);
        }
        cuddRef(x1);
        Cudd_RecursiveDeref(dd, y1_);
        Cudd_RecursiveDeref(dd, y2);
    }
    cuddDeref(x1);
    return(Cudd_Not(x1));

}